

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O0

vector<ConfigKey,_std::allocator<ConfigKey>_> * ConfigKey::available(void)

{
  initializer_list<ConfigKey> __l;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_RDI;
  allocator_type *in_stack_fffffffffffffe58;
  undefined1 **ppuVar1;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *in_stack_fffffffffffffe60;
  undefined1 **ppuVar2;
  iterator pCVar3;
  vector<ConfigKey,_std::allocator<ConfigKey>_> *pvVar4;
  undefined1 local_17d [77];
  undefined1 local_130 [56];
  undefined1 local_f8 [56];
  undefined1 local_c0 [56];
  undefined1 local_88 [56];
  undefined1 local_50 [56];
  undefined1 *local_18;
  undefined8 local_10;
  
  local_17d._13_8_ = local_17d + 0x15;
  pvVar4 = in_RDI;
  query_max_edge();
  local_17d._13_8_ = local_130;
  query_max_ngram();
  local_17d._13_8_ = local_f8;
  database_workers();
  local_17d._13_8_ = local_c0;
  merge_max_datasets();
  local_17d._13_8_ = local_88;
  merge_max_files();
  local_17d._13_8_ = local_50;
  iterator_gc_seconds();
  local_18 = local_17d + 0x15;
  local_10 = 6;
  pCVar3 = (iterator)local_17d;
  std::allocator<ConfigKey>::allocator((allocator<ConfigKey> *)0x176429);
  __l._M_len = (size_type)pvVar4;
  __l._M_array = pCVar3;
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::vector
            (in_stack_fffffffffffffe60,__l,in_stack_fffffffffffffe58);
  std::allocator<ConfigKey>::~allocator((allocator<ConfigKey> *)0x176454);
  ppuVar1 = (undefined1 **)(local_17d + 0x15);
  ppuVar2 = &local_18;
  do {
    ppuVar2 = ppuVar2 + -7;
    ~ConfigKey((ConfigKey *)0x17647c);
  } while (ppuVar2 != ppuVar1);
  return in_RDI;
}

Assistant:

static std::vector<ConfigKey> available() {
        return {
            query_max_edge(),     query_max_ngram(), database_workers(),
            merge_max_datasets(), merge_max_files(), iterator_gc_seconds(),
        };
    }